

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O0

EvalResult
EvalModel(IDenseNetwork *network,
         vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
         *data,vector<float,_std::allocator<float>_> *target,float simulationTime,float eps,
         string *logsPath)

{
  pointer *this;
  EvalResult EVar1;
  size_type sVar2;
  reference sample;
  ostream *poVar3;
  reference pvVar4;
  vector<float,_std::allocator<float>_> *pvVar5;
  float fVar6;
  float extraout_XMM0_Da;
  float local_344;
  float local_338;
  float local_32c;
  int guess;
  int predictedClassId;
  float loss;
  float S;
  vector<float,_std::allocator<float>_> softMax;
  vector<float,_std::allocator<float>_> deltas;
  vector<float,_std::allocator<float>_> output;
  int sampleId;
  undefined1 local_250 [8];
  ofstream out;
  float local_4c;
  float local_48;
  float squaredLossSum;
  float guesses;
  float totalLoss;
  string *logsPath_local;
  float eps_local;
  float simulationTime_local;
  vector<float,_std::allocator<float>_> *target_local;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *data_local;
  IDenseNetwork *network_local;
  
  squaredLossSum = 0.0;
  local_48 = 0.0;
  local_4c = 0.0;
  std::ofstream::ofstream(local_250);
  std::ofstream::open(local_250,logsPath,0x10);
  for (output.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      sVar2 = std::
              vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
              ::size(data),
      (ulong)(long)(int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage < sVar2;
      output.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    sample = std::
             vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
             ::operator[](data,(long)(int)output.super__Vector_base<float,_std::allocator<float>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    IDenseNetwork::Forward
              ((vector<float,_std::allocator<float>_> *)
               &deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,network,sample,simulationTime,false);
    if (((int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1) % 1000 == 0) {
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (&std::cout,
                          (int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 1);
      poVar3 = std::operator<<(poVar3," / ");
      sVar2 = std::
              vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
              ::size(data);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
      poVar3 = std::operator<<(poVar3," samples has been forwarded");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    this = &softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&loss);
    predictedClassId = 0;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (target,(long)(int)output.super__Vector_base<float,_std::allocator<float>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    fVar6 = SoftMaxLoss((vector<float,_std::allocator<float>_> *)
                        &deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,*pvVar4,
                        (vector<float,_std::allocator<float>_> *)&loss,
                        (vector<float,_std::allocator<float>_> *)this,(float *)&predictedClassId);
    poVar3 = (ostream *)std::ostream::operator<<(local_250,fVar6);
    std::operator<<(poVar3,",");
    squaredLossSum = squaredLossSum + fVar6;
    local_4c = fVar6 * fVar6 + local_4c;
    GetClassPrediction((vector<float,_std::allocator<float>_> *)
                       &deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pvVar5 = target;
    std::vector<float,_std::allocator<float>_>::operator[]
              (target,(long)(int)output.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    std::abs((int)pvVar5);
    local_48 = local_48 + (float)(extraout_XMM0_Da < eps);
    IDenseNetwork::Reset(network);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&loss);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::ofstream::close();
  sVar2 = std::
          vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
          ::size(data);
  local_32c = (float)sVar2;
  sVar2 = std::
          vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
          ::size(data);
  local_338 = (float)sVar2;
  sVar2 = std::
          vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
          ::size(data);
  local_344 = (float)sVar2;
  std::ofstream::~ofstream(local_250);
  EVar1.meanLoss = squaredLossSum / local_338;
  EVar1.accuracy = local_48 / local_32c;
  EVar1.meanSquaredLoss = local_4c / local_344;
  return EVar1;
}

Assistant:

EvalResult EvalModel( IDenseNetwork *network, std::vector<SPIKING_NN::SpikeTrain> &data,
                      std::vector<SPIKING_NN::Target> &target, float
                      simulationTime, float
                      eps,
                      std::string &logsPath )
{
    float totalLoss = 0;
    float guesses = 0;
    float squaredLossSum = 0;
    std::ofstream out;
    out.open( logsPath );

    for ( int sampleId = 0; sampleId < data.size(); sampleId++ ) {
        std::vector<float> output = network->Forward( data[sampleId], simulationTime, false );
        if (( sampleId + 1 ) % 1000 == 0 ) {
            std::cout << sampleId + 1 << " / " << data.size() << " samples has been forwarded" << std::endl;
        }

        std::vector<float> deltas;
        std::vector<float> softMax;
        float S = 0;
        float loss = SoftMaxLoss( output, target[sampleId], softMax, deltas, &S );
        out << loss << ",";
        totalLoss += loss;
        squaredLossSum += loss * loss;
        int predictedClassId = GetClassPrediction( output );
        int guess = abs((float) predictedClassId - target[sampleId] ) < eps;
        guesses += guess;
        network->Reset();
    }
    out.close();
    return {guesses / data.size(), totalLoss / data.size(), squaredLossSum / data.size()};
}